

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGen.c
# Opt level: O0

void Gia_ManObjSimAnd(Gia_Man_t *p,int iObj)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  word *pwVar2;
  word *pwVar3;
  word *pwVar4;
  word *pSim1;
  word *pSim0;
  word *pSim;
  Gia_Obj_t *pObj;
  int w;
  int iObj_local;
  Gia_Man_t *p_local;
  
  pObj_00 = Gia_ManObj(p,iObj);
  pwVar2 = Gia_ManObjSim(p,iObj);
  iVar1 = Gia_ObjFaninId0(pObj_00,iObj);
  pwVar3 = Gia_ManObjSim(p,iVar1);
  iVar1 = Gia_ObjFaninId1(pObj_00,iObj);
  pwVar4 = Gia_ManObjSim(p,iVar1);
  iVar1 = Gia_ObjFaninC0(pObj_00);
  if ((iVar1 == 0) || (iVar1 = Gia_ObjFaninC1(pObj_00), iVar1 == 0)) {
    iVar1 = Gia_ObjFaninC0(pObj_00);
    if ((iVar1 == 0) || (iVar1 = Gia_ObjFaninC1(pObj_00), iVar1 != 0)) {
      iVar1 = Gia_ObjFaninC0(pObj_00);
      if ((iVar1 == 0) && (iVar1 = Gia_ObjFaninC1(pObj_00), iVar1 != 0)) {
        for (pObj._0_4_ = 0; (int)pObj < p->nSimWords; pObj._0_4_ = (int)pObj + 1) {
          pwVar2[(int)pObj] = pwVar3[(int)pObj] & (pwVar4[(int)pObj] ^ 0xffffffffffffffff);
        }
      }
      else {
        for (pObj._0_4_ = 0; (int)pObj < p->nSimWords; pObj._0_4_ = (int)pObj + 1) {
          pwVar2[(int)pObj] = pwVar3[(int)pObj] & pwVar4[(int)pObj];
        }
      }
    }
    else {
      for (pObj._0_4_ = 0; (int)pObj < p->nSimWords; pObj._0_4_ = (int)pObj + 1) {
        pwVar2[(int)pObj] = (pwVar3[(int)pObj] ^ 0xffffffffffffffff) & pwVar4[(int)pObj];
      }
    }
  }
  else {
    for (pObj._0_4_ = 0; (int)pObj < p->nSimWords; pObj._0_4_ = (int)pObj + 1) {
      pwVar2[(int)pObj] =
           (pwVar3[(int)pObj] ^ 0xffffffffffffffff) & (pwVar4[(int)pObj] ^ 0xffffffffffffffff);
    }
  }
  return;
}

Assistant:

static inline void Gia_ManObjSimAnd( Gia_Man_t * p, int iObj )
{
    int w;
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
    word * pSim  = Gia_ManObjSim( p, iObj );
    word * pSim0 = Gia_ManObjSim( p, Gia_ObjFaninId0(pObj, iObj) );
    word * pSim1 = Gia_ManObjSim( p, Gia_ObjFaninId1(pObj, iObj) );
    if ( Gia_ObjFaninC0(pObj) && Gia_ObjFaninC1(pObj) )
        for ( w = 0; w < p->nSimWords; w++ )
            pSim[w] = ~pSim0[w] & ~pSim1[w];
    else if ( Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj) )
        for ( w = 0; w < p->nSimWords; w++ )
            pSim[w] = ~pSim0[w] & pSim1[w];
    else if ( !Gia_ObjFaninC0(pObj) && Gia_ObjFaninC1(pObj) )
        for ( w = 0; w < p->nSimWords; w++ )
            pSim[w] = pSim0[w] & ~pSim1[w];
    else
        for ( w = 0; w < p->nSimWords; w++ )
            pSim[w] = pSim0[w] & pSim1[w];
}